

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O1

void __thiscall CTxOut::CTxOut(CTxOut *this)

{
  uint uVar1;
  long lVar2;
  size_type new_capacity;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(this->scriptPubKey).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->scriptPubKey).super_CScriptBase._union + 0x18) = 0;
  (this->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->scriptPubKey).super_CScriptBase._union + 8) = 0;
  this->nValue = -1;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            (&(this->scriptPubKey).super_CScriptBase,0);
  uVar1 = (this->scriptPubKey).super_CScriptBase._size;
  new_capacity = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    new_capacity = uVar1;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            (&(this->scriptPubKey).super_CScriptBase,new_capacity);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxOut()
    {
        SetNull();
    }